

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nosimd.h
# Opt level: O0

void nosimd::arithmetic::add<short>(short *pSrc1,short *pSrc2,short *pDst,int len)

{
  int local_30;
  int local_2c;
  int i_2;
  int i_1;
  int i;
  int len_local;
  short *pDst_local;
  short *pSrc2_local;
  short *pSrc1_local;
  
  if (pSrc1 == pDst) {
    for (i_2 = 0; i_2 < len; i_2 = i_2 + 1) {
      pDst[i_2] = pDst[i_2] + pSrc2[i_2];
    }
  }
  else if (pSrc2 == pDst) {
    for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
      pDst[local_2c] = pDst[local_2c] + pSrc1[local_2c];
    }
  }
  else {
    for (local_30 = 0; local_30 < len; local_30 = local_30 + 1) {
      pDst[local_30] = pSrc1[local_30] + pSrc2[local_30];
    }
  }
  return;
}

Assistant:

inline void add(const _T * pSrc1, const _T * pSrc2, _T * pDst, int len)
        {
            if (pSrc1 == pDst)
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] += pSrc2[i];
            }
            else if(pSrc2 == pDst)
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] += pSrc1[i];
            }
            else
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] = pSrc1[i] + pSrc2[i];
            }
        }